

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgNameAllocator.cpp
# Opt level: O2

string * __thiscall
rsg::nameNdxToStr_abi_cxx11_(string *__return_storage_ptr__,rsg *this,deUint32 name)

{
  pointer pcVar1;
  ulong uVar2;
  ulong uVar3;
  allocator<char> local_19;
  
  uVar3 = (ulong)this & 0xffffffff;
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_19);
  while( true ) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if ((uint)uVar3 < 0x1b) break;
    uVar2 = (ulong)((uint)uVar3 - 1);
    uVar3 = uVar2 / 0x1a;
    std::__cxx11::string::insert(__return_storage_ptr__,pcVar1,(char)(uVar2 % 0x1a) + 'a');
  }
  std::__cxx11::string::insert(__return_storage_ptr__,pcVar1,(int)(char)((byte)uVar3 | 0x60));
  return __return_storage_ptr__;
}

Assistant:

inline std::string nameNdxToStr (deUint32 name)
{
	std::string	str			= "";
	deUint32	alphabetLen	= 'z' - 'a' + 1;

	while (name > alphabetLen)
	{
		str.insert(str.begin(), (char)('a' + ((name-1)%alphabetLen)));
		name = ((name-1) / alphabetLen);
	}

	str.insert(str.begin(), (char)('a' + (name%(alphabetLen+1)) - 1));

	return str;
}